

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r,int a)

{
  int in_ESI;
  secp256k1_fe *in_RDI;
  uint in_stack_fffffffffffffff0;
  uint uVar1;
  
  secp256k1_fe_verify((secp256k1_fe *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  uVar1 = in_stack_fffffffffffffff0 & 0xffffff;
  if (-1 < in_ESI) {
    uVar1 = CONCAT13(in_ESI < 0x21,(int3)in_stack_fffffffffffffff0);
  }
  if ((((byte)(uVar1 >> 0x18) ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x132,"test condition failed: a >= 0 && a <= 32");
    abort();
  }
  if (0x20 < in_ESI * in_RDI->magnitude) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x133,"test condition failed: a*r->magnitude <= 32");
    abort();
  }
  secp256k1_fe_impl_mul_int_unchecked(in_RDI,in_ESI);
  in_RDI->magnitude = in_ESI * in_RDI->magnitude;
  in_RDI->normalized = 0;
  secp256k1_fe_verify((secp256k1_fe *)CONCAT44(in_ESI,uVar1));
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r, int a) {
    secp256k1_fe_verify(r);
    VERIFY_CHECK(a >= 0 && a <= 32);
    VERIFY_CHECK(a*r->magnitude <= 32);
    secp256k1_fe_impl_mul_int_unchecked(r, a);
    r->magnitude *= a;
    r->normalized = 0;
    secp256k1_fe_verify(r);
}